

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O1

void __thiscall CppJieba::MixSegment::~MixSegment(MixSegment *this)

{
  (this->super_SegmentBase).super_ISegment._vptr_ISegment = (_func_int **)&PTR__MixSegment_0011bbe8;
  if ((this->super_SegmentBase)._isInited == true) {
    if ((this->_mpSeg).super_SegmentBase._isInited == true) {
      Trie::dispose(&(this->_mpSeg)._trie);
      (this->_mpSeg).super_SegmentBase._isInited = false;
    }
    (this->_hmmSeg).super_SegmentBase._isInited = false;
    (this->super_SegmentBase)._isInited = false;
  }
  HMMSegment::~HMMSegment(&this->_hmmSeg);
  MPSegment::~MPSegment(&this->_mpSeg);
  return;
}

Assistant:

virtual ~MixSegment()
            {
                dispose();
            }